

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

void gmlc::networking::contextProcessingLoop(shared_ptr<gmlc::networking::AsioContextManager> *ptr)

{
  bool bVar1;
  __int_type _Var2;
  element_type *peVar3;
  __shared_ptr *in_RDI;
  time_point nclk_1;
  system_error *se;
  time_point nclk;
  exception *e;
  time_point clk;
  __atomic_base<int> *in_stack_ffffffffffffff38;
  io_context *in_stack_ffffffffffffff40;
  byte local_59;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    while( true ) {
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x75f784);
      _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff38);
      local_59 = 0;
      if (0 < _Var2) {
        std::
        __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x75f7aa);
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff38);
        local_59 = bVar1 ^ 0xff;
      }
      if ((local_59 & 1) == 0) break;
      std::chrono::_V2::steady_clock::now();
      peVar3 = std::
               __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x75f7e6);
      std::atomic<gmlc::networking::AsioContextManager::loop_mode>::store
                (&peVar3->running,running,seq_cst);
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x75f809);
      std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
                ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x75f815);
      asio::io_context::run(in_stack_ffffffffffffff40);
    }
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x75fb45);
    std::atomic<gmlc::networking::AsioContextManager::loop_mode>::store
              (&peVar3->running,stopped,seq_cst);
  }
  return;
}

Assistant:

void contextProcessingLoop(std::shared_ptr<AsioContextManager> ptr)
{
    if (!ptr) {
        return;
    }
    while ((ptr->runCounter > 0) && (!(ptr->terminateLoop))) {
        auto clk = std::chrono::steady_clock::now();
        try {
            ptr->running.store(AsioContextManager::loop_mode::running);
            ptr->ictx->run();
        }
        catch (const std::system_error& se) {
            auto nclk = std::chrono::steady_clock::now();
            std::cerr << "asio system error in context loop " << se.what()
                      << " ran for " << (nclk - clk).count() / 1000000 << "ms"
                      << std::endl;
        }
        catch (const std::exception& e) {
            auto nclk = std::chrono::steady_clock::now();
            std::cerr << "std::exception in context loop " << e.what()
                      << " ran for " << (nclk - clk).count() / 1000000 << "ms"
                      << std::endl;
        }
        catch (...) {
            std::cout << "caught other error in context loop" << std::endl;
        }
    }

    //   std::cout << "context loop stopped\n";
    ptr->running.store(AsioContextManager::loop_mode::stopped);
}